

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O0

Vector<float,_4> __thiscall
tcu::refract<float,4>(tcu *this,Vector<float,_4> *i,Vector<float,_4> *n,float eta)

{
  float fVar1;
  float fVar2;
  Vector<float,_4> *a;
  undefined8 extraout_XMM0_Qa;
  double dVar3;
  undefined8 uVar4;
  Vector<float,_4> VVar5;
  Vector<float,_4> VVar6;
  Vector<float,_4> local_4c;
  Vector<float,_4> local_3c;
  float local_2c;
  float local_28;
  float k;
  float cosAngle;
  float eta_local;
  Vector<float,_4> *n_local;
  Vector<float,_4> *i_local;
  undefined1 auVar7 [12];
  undefined8 uVar8;
  
  k = eta;
  _cosAngle = n;
  n_local = i;
  i_local = (Vector<float,_4> *)this;
  local_28 = dot<float,4>(n,i);
  uVar4 = 0x3f800000;
  local_2c = -(k * k) * (-local_28 * local_28 + 1.0) + 1.0;
  if (0.0 <= local_2c) {
    operator*((tcu *)&local_3c,n_local,k);
    a = _cosAngle;
    fVar2 = k;
    fVar1 = local_28;
    dVar3 = std::sqrt((double)(ulong)(uint)local_2c);
    operator*((tcu *)&local_4c,a,fVar2 * fVar1 + SUB84(dVar3,0));
    VVar5 = operator-(this,&local_3c,&local_4c);
  }
  else {
    Vector<float,_4>::Vector((Vector<float,_4> *)this,0.0);
    VVar5.m_data[2] = (float)(int)uVar4;
    VVar5.m_data[3] = (float)(int)((ulong)uVar4 >> 0x20);
    VVar5.m_data[0] = (float)(int)extraout_XMM0_Qa;
    VVar5.m_data[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  }
  VVar6.m_data[0] = VVar5.m_data[0];
  auVar7._4_4_ = VVar5.m_data[1];
  register0x00001240 = VVar5.m_data[2];
  register0x00001244 = VVar5.m_data[3];
  return (Vector<float,_4>)VVar6.m_data;
}

Assistant:

inline Vector<T, Size> refract (const Vector<T, Size>& i, const Vector<T, Size>& n, T eta)
{
	T cosAngle = dot(n, i);
	T k = T(1) - eta * eta * (T(1) - cosAngle * cosAngle);
	if (k < T(0))
		return Vector<T, Size>(T(0));
	else
		return i * eta - n * T(eta * cosAngle + ::sqrt(k));
}